

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converttif.c
# Opt level: O0

void tif_14uto32s(OPJ_BYTE *pSrc,OPJ_INT32 *pDst,OPJ_SIZE_T length)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  OPJ_INT32 OVar7;
  byte *pbVar8;
  OPJ_UINT32 val5_1;
  OPJ_UINT32 val4_1;
  OPJ_UINT32 val3_1;
  OPJ_UINT32 val2_1;
  OPJ_UINT32 val1_1;
  OPJ_UINT32 val0_1;
  OPJ_UINT32 val6;
  OPJ_UINT32 val5;
  OPJ_UINT32 val4;
  OPJ_UINT32 val3;
  OPJ_UINT32 val2;
  OPJ_UINT32 val1;
  OPJ_UINT32 val0;
  OPJ_SIZE_T i;
  OPJ_SIZE_T length_local;
  OPJ_INT32 *pDst_local;
  OPJ_BYTE *pSrc_local;
  
  pDst_local = (OPJ_INT32 *)pSrc;
  for (_val1 = 0; _val1 < (length & 0xfffffffffffffffc); _val1 = _val1 + 4) {
    OVar7 = *pDst_local;
    bVar1 = *(byte *)((long)pDst_local + 1);
    bVar2 = *(byte *)((long)pDst_local + 2);
    bVar3 = *(byte *)((long)pDst_local + 3);
    bVar4 = *(byte *)(pDst_local + 1);
    pbVar8 = (byte *)((long)pDst_local + 6);
    bVar5 = *(byte *)((long)pDst_local + 5);
    pDst_local = (OPJ_INT32 *)((long)pDst_local + 7);
    bVar6 = *pbVar8;
    pDst[_val1] = (uint)(byte)OVar7 << 6 | (uint)(bVar1 >> 2);
    pDst[_val1 + 1] = (bVar1 & 3) << 0xc | (uint)bVar2 << 4 | (uint)(bVar3 >> 4);
    pDst[_val1 + 2] = (bVar3 & 0xf) << 10 | (uint)bVar4 << 2 | (uint)(bVar5 >> 6);
    pDst[_val1 + 3] = (bVar5 & 0x3f) << 8 | (uint)bVar6;
  }
  if ((length & 3) != 0) {
    bVar1 = *(byte *)((long)pDst_local + 1);
    pDst[_val1] = (uint)(byte)*pDst_local << 6 | (uint)(bVar1 >> 2);
    if (1 < (length & 3)) {
      bVar2 = *(byte *)((long)pDst_local + 3);
      pDst[_val1 + 1] =
           (bVar1 & 3) << 0xc | (uint)*(byte *)((long)pDst_local + 2) << 4 | (uint)(bVar2 >> 4);
      if (2 < (length & 3)) {
        pDst[_val1 + 2] =
             (bVar2 & 0xf) << 10 | (uint)*(byte *)(pDst_local + 1) << 2 |
             (uint)(*(byte *)((long)pDst_local + 5) >> 6);
      }
    }
  }
  return;
}

Assistant:

static void tif_14uto32s(const OPJ_BYTE* pSrc, OPJ_INT32* pDst, OPJ_SIZE_T length)
{
	OPJ_SIZE_T i;
	for (i = 0; i < (length & ~(OPJ_SIZE_T)3U); i+=4U) {
		OPJ_UINT32 val0 = *pSrc++;
		OPJ_UINT32 val1 = *pSrc++;
		OPJ_UINT32 val2 = *pSrc++;
		OPJ_UINT32 val3 = *pSrc++;
		OPJ_UINT32 val4 = *pSrc++;
		OPJ_UINT32 val5 = *pSrc++;
		OPJ_UINT32 val6 = *pSrc++;
		
		pDst[i+0] = (OPJ_INT32)((val0 << 6) | (val1 >> 2));
		pDst[i+1] = (OPJ_INT32)(((val1 & 0x3U) << 12) | (val2 << 4) | (val3 >> 4));
		pDst[i+2] = (OPJ_INT32)(((val3 & 0xFU) << 10) | (val4 << 2) | (val5 >> 6));
		pDst[i+3] = (OPJ_INT32)(((val5 & 0x3FU) << 8) | val6);
		
	}
	if (length & 3U) {
		OPJ_UINT32 val0 = *pSrc++;
		OPJ_UINT32 val1 = *pSrc++;
		length = length & 3U;
		pDst[i+0] = (OPJ_INT32)((val0 << 6) | (val1 >> 2));
		
		if (length > 1U) {
			OPJ_UINT32 val2 = *pSrc++;
			OPJ_UINT32 val3 = *pSrc++;
			pDst[i+1] = (OPJ_INT32)(((val1 & 0x3U) << 12) | (val2 << 4) | (val3 >> 4));
			if (length > 2U) {
				OPJ_UINT32 val4 = *pSrc++;
				OPJ_UINT32 val5 = *pSrc++;
				pDst[i+2] = (OPJ_INT32)(((val3 & 0xFU) << 10) | (val4 << 2) | (val5 >> 6));
			}
		}
	}
}